

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# text_format.cc
# Opt level: O0

void __thiscall
google::protobuf::TextFormat::Printer::PrintUnknownFields
          (Printer *this,UnknownFieldSet *unknown_fields,TextGenerator *generator,
          int recursion_budget)

{
  bool bVar1;
  int iVar2;
  Type TVar3;
  uint32_t v;
  uint64_t uVar4;
  string *src;
  uint8_t *buffer;
  ulong uVar5;
  UnknownFieldSet *unknown_fields_00;
  AlphaNum *a;
  AlphaNum *a_00;
  Hex hex;
  Hex hex_00;
  StringPiece local_320;
  StringPiece local_310;
  StringPiece local_300;
  StringPiece local_2f0;
  string local_2e0;
  StringPiece local_2c0;
  StringPiece local_2b0;
  StringPiece local_2a0;
  StringPiece local_290;
  StringPiece local_280;
  StringPiece local_270;
  undefined1 local_260 [8];
  UnknownFieldSet embedded_unknown_fields;
  CodedInputStream input_stream;
  string *value;
  undefined4 local_1e8;
  AlphaNum local_1e0;
  string local_1b0;
  StringPiece local_190;
  StringPiece local_180;
  undefined1 local_170 [12];
  AlphaNum local_160;
  string local_130;
  StringPiece local_110;
  StringPiece local_100;
  AlphaNum local_f0;
  string local_c0;
  StringPiece local_a0 [2];
  AlphaNum local_80;
  undefined1 local_50 [8];
  string field_number;
  UnknownField *field;
  int i;
  int recursion_budget_local;
  TextGenerator *generator_local;
  UnknownFieldSet *unknown_fields_local;
  Printer *this_local;
  AlphaNum *a_01;
  AlphaNum *a_02;
  
  for (field._0_4_ = 0; iVar2 = UnknownFieldSet::field_count(unknown_fields), (int)field < iVar2;
      field._0_4_ = (int)field + 1) {
    field_number.field_2._8_8_ = UnknownFieldSet::field(unknown_fields,(int)field);
    iVar2 = UnknownField::number((UnknownField *)field_number.field_2._8_8_);
    strings::AlphaNum::AlphaNum(&local_80,iVar2);
    StrCat_abi_cxx11_((string *)local_50,(protobuf *)&local_80,a);
    TVar3 = UnknownField::type((UnknownField *)field_number.field_2._8_8_);
    switch(TVar3) {
    case TYPE_VARINT:
      BaseTextGenerator::PrintString(&generator->super_BaseTextGenerator,(string *)local_50);
      stringpiece_internal::StringPiece::StringPiece(local_a0,": ");
      TextGenerator::PrintMaybeWithMarker(generator,local_a0[0]);
      uVar4 = UnknownField::varint((UnknownField *)field_number.field_2._8_8_);
      strings::AlphaNum::AlphaNum(&local_f0,uVar4);
      StrCat_abi_cxx11_(&local_c0,(protobuf *)&local_f0,a_00);
      BaseTextGenerator::PrintString(&generator->super_BaseTextGenerator,&local_c0);
      std::__cxx11::string::~string((string *)&local_c0);
      if ((this->single_line_mode_ & 1U) == 0) {
        BaseTextGenerator::PrintLiteral<2ul>
                  (&generator->super_BaseTextGenerator,(char (*) [2])0x774153);
      }
      else {
        BaseTextGenerator::PrintLiteral<2ul>
                  (&generator->super_BaseTextGenerator,(char (*) [2])0x7d13d3);
      }
      break;
    case TYPE_FIXED32:
      BaseTextGenerator::PrintString(&generator->super_BaseTextGenerator,(string *)local_50);
      stringpiece_internal::StringPiece::StringPiece(&local_100,": ");
      stringpiece_internal::StringPiece::StringPiece(&local_110,"0x");
      TextGenerator::PrintMaybeWithMarker(generator,local_100,local_110);
      v = UnknownField::fixed32((UnknownField *)field_number.field_2._8_8_);
      strings::Hex::Hex<unsigned_int>((Hex *)local_170,v,ZERO_PAD_8);
      hex._12_4_ = 0;
      hex.value = local_170._0_8_;
      hex.spec = local_170._8_4_;
      strings::AlphaNum::AlphaNum(&local_160,hex);
      StrCat_abi_cxx11_(&local_130,(protobuf *)&local_160,a_01);
      BaseTextGenerator::PrintString(&generator->super_BaseTextGenerator,&local_130);
      std::__cxx11::string::~string((string *)&local_130);
      if ((this->single_line_mode_ & 1U) == 0) {
        BaseTextGenerator::PrintLiteral<2ul>
                  (&generator->super_BaseTextGenerator,(char (*) [2])0x774153);
      }
      else {
        BaseTextGenerator::PrintLiteral<2ul>
                  (&generator->super_BaseTextGenerator,(char (*) [2])0x7d13d3);
      }
      break;
    case TYPE_FIXED64:
      BaseTextGenerator::PrintString(&generator->super_BaseTextGenerator,(string *)local_50);
      stringpiece_internal::StringPiece::StringPiece(&local_180,": ");
      stringpiece_internal::StringPiece::StringPiece(&local_190,"0x");
      TextGenerator::PrintMaybeWithMarker(generator,local_180,local_190);
      uVar4 = UnknownField::fixed64((UnknownField *)field_number.field_2._8_8_);
      strings::Hex::Hex<unsigned_long>((Hex *)&value,uVar4,ZERO_PAD_16);
      hex_00._12_4_ = 0;
      hex_00.value = (uint64)value;
      hex_00.spec = local_1e8;
      strings::AlphaNum::AlphaNum(&local_1e0,hex_00);
      StrCat_abi_cxx11_(&local_1b0,(protobuf *)&local_1e0,a_02);
      BaseTextGenerator::PrintString(&generator->super_BaseTextGenerator,&local_1b0);
      std::__cxx11::string::~string((string *)&local_1b0);
      if ((this->single_line_mode_ & 1U) == 0) {
        BaseTextGenerator::PrintLiteral<2ul>
                  (&generator->super_BaseTextGenerator,(char (*) [2])0x774153);
      }
      else {
        BaseTextGenerator::PrintLiteral<2ul>
                  (&generator->super_BaseTextGenerator,(char (*) [2])0x7d13d3);
      }
      break;
    case TYPE_LENGTH_DELIMITED:
      BaseTextGenerator::PrintString(&generator->super_BaseTextGenerator,(string *)local_50);
      src = UnknownField::length_delimited_abi_cxx11_((UnknownField *)field_number.field_2._8_8_);
      buffer = (uint8_t *)std::__cxx11::string::data();
      iVar2 = std::__cxx11::string::size();
      io::CodedInputStream::CodedInputStream
                ((CodedInputStream *)
                 &embedded_unknown_fields.fields_.
                  super__Vector_base<google::protobuf::UnknownField,_std::allocator<google::protobuf::UnknownField>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage,buffer,iVar2);
      io::CodedInputStream::SetRecursionLimit
                ((CodedInputStream *)
                 &embedded_unknown_fields.fields_.
                  super__Vector_base<google::protobuf::UnknownField,_std::allocator<google::protobuf::UnknownField>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage,recursion_budget);
      UnknownFieldSet::UnknownFieldSet((UnknownFieldSet *)local_260);
      uVar5 = std::__cxx11::string::empty();
      if ((((uVar5 & 1) == 0) && (0 < recursion_budget)) &&
         (bVar1 = UnknownFieldSet::ParseFromCodedStream
                            ((UnknownFieldSet *)local_260,
                             (CodedInputStream *)
                             &embedded_unknown_fields.fields_.
                              super__Vector_base<google::protobuf::UnknownField,_std::allocator<google::protobuf::UnknownField>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage), bVar1)) {
        if ((this->single_line_mode_ & 1U) == 0) {
          stringpiece_internal::StringPiece::StringPiece(&local_290," ");
          stringpiece_internal::StringPiece::StringPiece(&local_2a0,"{\n");
          TextGenerator::PrintMaybeWithMarker(generator,local_290,local_2a0);
          (*(generator->super_BaseTextGenerator)._vptr_BaseTextGenerator[2])();
        }
        else {
          stringpiece_internal::StringPiece::StringPiece(&local_270," ");
          stringpiece_internal::StringPiece::StringPiece(&local_280,"{ ");
          TextGenerator::PrintMaybeWithMarker(generator,local_270,local_280);
        }
        PrintUnknownFields(this,(UnknownFieldSet *)local_260,generator,recursion_budget + -1);
        if ((this->single_line_mode_ & 1U) == 0) {
          (*(generator->super_BaseTextGenerator)._vptr_BaseTextGenerator[3])();
          BaseTextGenerator::PrintLiteral<3ul>
                    (&generator->super_BaseTextGenerator,(char (*) [3])0x7b873b);
        }
        else {
          BaseTextGenerator::PrintLiteral<3ul>
                    (&generator->super_BaseTextGenerator,(char (*) [3])"} ");
        }
      }
      else {
        stringpiece_internal::StringPiece::StringPiece(&local_2b0,": ");
        stringpiece_internal::StringPiece::StringPiece(&local_2c0,"\"");
        TextGenerator::PrintMaybeWithMarker(generator,local_2b0,local_2c0);
        CEscape(&local_2e0,src);
        BaseTextGenerator::PrintString(&generator->super_BaseTextGenerator,&local_2e0);
        std::__cxx11::string::~string((string *)&local_2e0);
        if ((this->single_line_mode_ & 1U) == 0) {
          BaseTextGenerator::PrintLiteral<3ul>
                    (&generator->super_BaseTextGenerator,(char (*) [3])0x77ee99);
        }
        else {
          BaseTextGenerator::PrintLiteral<3ul>
                    (&generator->super_BaseTextGenerator,(char (*) [3])"\" ");
        }
      }
      UnknownFieldSet::~UnknownFieldSet((UnknownFieldSet *)local_260);
      io::CodedInputStream::~CodedInputStream
                ((CodedInputStream *)
                 &embedded_unknown_fields.fields_.
                  super__Vector_base<google::protobuf::UnknownField,_std::allocator<google::protobuf::UnknownField>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage);
      break;
    case TYPE_GROUP:
      BaseTextGenerator::PrintString(&generator->super_BaseTextGenerator,(string *)local_50);
      if ((this->single_line_mode_ & 1U) == 0) {
        stringpiece_internal::StringPiece::StringPiece(&local_310," ");
        stringpiece_internal::StringPiece::StringPiece(&local_320,"{\n");
        TextGenerator::PrintMaybeWithMarker(generator,local_310,local_320);
        (*(generator->super_BaseTextGenerator)._vptr_BaseTextGenerator[2])();
      }
      else {
        stringpiece_internal::StringPiece::StringPiece(&local_2f0," ");
        stringpiece_internal::StringPiece::StringPiece(&local_300,"{ ");
        TextGenerator::PrintMaybeWithMarker(generator,local_2f0,local_300);
      }
      unknown_fields_00 = UnknownField::group((UnknownField *)field_number.field_2._8_8_);
      PrintUnknownFields(this,unknown_fields_00,generator,recursion_budget + -1);
      if ((this->single_line_mode_ & 1U) == 0) {
        (*(generator->super_BaseTextGenerator)._vptr_BaseTextGenerator[3])();
        BaseTextGenerator::PrintLiteral<3ul>
                  (&generator->super_BaseTextGenerator,(char (*) [3])0x7b873b);
      }
      else {
        BaseTextGenerator::PrintLiteral<3ul>(&generator->super_BaseTextGenerator,(char (*) [3])"} ")
        ;
      }
    }
    std::__cxx11::string::~string((string *)local_50);
  }
  return;
}

Assistant:

void TextFormat::Printer::PrintUnknownFields(
    const UnknownFieldSet& unknown_fields, TextGenerator* generator,
    int recursion_budget) const {
  for (int i = 0; i < unknown_fields.field_count(); i++) {
    const UnknownField& field = unknown_fields.field(i);
    std::string field_number = StrCat(field.number());

    switch (field.type()) {
      case UnknownField::TYPE_VARINT:
        generator->PrintString(field_number);
        generator->PrintMaybeWithMarker(": ");
        generator->PrintString(StrCat(field.varint()));
        if (single_line_mode_) {
          generator->PrintLiteral(" ");
        } else {
          generator->PrintLiteral("\n");
        }
        break;
      case UnknownField::TYPE_FIXED32: {
        generator->PrintString(field_number);
        generator->PrintMaybeWithMarker(": ", "0x");
        generator->PrintString(
            StrCat(strings::Hex(field.fixed32(), strings::ZERO_PAD_8)));
        if (single_line_mode_) {
          generator->PrintLiteral(" ");
        } else {
          generator->PrintLiteral("\n");
        }
        break;
      }
      case UnknownField::TYPE_FIXED64: {
        generator->PrintString(field_number);
        generator->PrintMaybeWithMarker(": ", "0x");
        generator->PrintString(
            StrCat(strings::Hex(field.fixed64(), strings::ZERO_PAD_16)));
        if (single_line_mode_) {
          generator->PrintLiteral(" ");
        } else {
          generator->PrintLiteral("\n");
        }
        break;
      }
      case UnknownField::TYPE_LENGTH_DELIMITED: {
        generator->PrintString(field_number);
        const std::string& value = field.length_delimited();
        // We create a CodedInputStream so that we can adhere to our recursion
        // budget when we attempt to parse the data. UnknownFieldSet parsing is
        // recursive because of groups.
        io::CodedInputStream input_stream(
            reinterpret_cast<const uint8_t*>(value.data()), value.size());
        input_stream.SetRecursionLimit(recursion_budget);
        UnknownFieldSet embedded_unknown_fields;
        if (!value.empty() && recursion_budget > 0 &&
            embedded_unknown_fields.ParseFromCodedStream(&input_stream)) {
          // This field is parseable as a Message.
          // So it is probably an embedded message.
          if (single_line_mode_) {
            generator->PrintMaybeWithMarker(" ", "{ ");
          } else {
            generator->PrintMaybeWithMarker(" ", "{\n");
            generator->Indent();
          }
          PrintUnknownFields(embedded_unknown_fields, generator,
                             recursion_budget - 1);
          if (single_line_mode_) {
            generator->PrintLiteral("} ");
          } else {
            generator->Outdent();
            generator->PrintLiteral("}\n");
          }
        } else {
          // This field is not parseable as a Message (or we ran out of
          // recursion budget). So it is probably just a plain string.
          generator->PrintMaybeWithMarker(": ", "\"");
          generator->PrintString(CEscape(value));
          if (single_line_mode_) {
            generator->PrintLiteral("\" ");
          } else {
            generator->PrintLiteral("\"\n");
          }
        }
        break;
      }
      case UnknownField::TYPE_GROUP:
        generator->PrintString(field_number);
        if (single_line_mode_) {
          generator->PrintMaybeWithMarker(" ", "{ ");
        } else {
          generator->PrintMaybeWithMarker(" ", "{\n");
          generator->Indent();
        }
        // For groups, we recurse without checking the budget. This is OK,
        // because if the groups were too deeply nested then we would have
        // already rejected the message when we originally parsed it.
        PrintUnknownFields(field.group(), generator, recursion_budget - 1);
        if (single_line_mode_) {
          generator->PrintLiteral("} ");
        } else {
          generator->Outdent();
          generator->PrintLiteral("}\n");
        }
        break;
    }
  }
}